

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void djb::brdf::hd_to_io(vec3 *wh,vec3 *wd,vec3 *wi,vec3 *wo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  vec3 vVar4;
  float_t phi_h;
  float_t theta_h;
  float_t local_84;
  vec3 *local_80;
  float_t local_74;
  vec3 local_70;
  vec3 local_60;
  vec3 local_50;
  vec3 local_40;
  
  local_40.x = 0.0;
  local_40.y = 1.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 1.0;
  local_80 = wo;
  xyz_to_theta_phi(wh,&local_74,&local_84);
  local_60 = rotate_vector(wd,&local_40,local_74);
  local_70 = rotate_vector(&local_60,&local_50,local_84);
  vVar4 = normalize(&local_70);
  *wi = vVar4;
  uVar1 = wh->x;
  uVar2 = wh->y;
  fVar3 = vVar4.z * wh->z + vVar4.x * (float)uVar1 + vVar4.y * (float)uVar2;
  fVar3 = fVar3 + fVar3;
  local_70.y = fVar3 * (float)uVar2 - vVar4.y;
  local_70.x = fVar3 * (float)uVar1 - vVar4.x;
  local_70.z = wh->z * fVar3 - vVar4.z;
  vVar4 = normalize(&local_70);
  *local_80 = vVar4;
  return;
}

Assistant:

void brdf::hd_to_io(const vec3 &wh, const vec3 &wd, vec3 *wi, vec3 *wo)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	xyz_to_theta_phi(wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wd, y, theta_h);
	(*wi) = normalize(rotate_vector(tmp, z, phi_h));
	(*wo) = normalize(2 * dot((*wi), wh) * wh - (*wi));
}